

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

void __thiscall Rml::DataViewFor::DataViewFor(DataViewFor *this,Element *element)

{
  DataView::DataView(&this->super_DataView,element,0);
  (this->super_DataView).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewFor_00396878;
  (this->container_address).
  super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container_address).
  super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->container_address).
  super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->iterator_name)._M_dataplus._M_p = (pointer)&(this->iterator_name).field_2;
  (this->iterator_name)._M_string_length = 0;
  (this->iterator_name).field_2._M_local_buf[0] = '\0';
  (this->iterator_index_name)._M_dataplus._M_p = (pointer)&(this->iterator_index_name).field_2;
  (this->iterator_index_name)._M_string_length = 0;
  (this->iterator_index_name).field_2._M_local_buf[0] = '\0';
  (this->rml_contents)._M_dataplus._M_p = (pointer)&(this->rml_contents).field_2;
  (this->rml_contents)._M_string_length = 0;
  (this->rml_contents).field_2._M_local_buf[0] = '\0';
  (this->attributes).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attributes).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DataViewFor::DataViewFor(Element* element) : DataView(element, 0) {}